

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O2

void __thiscall
OpenMD::ReplicateVisitor::replicate
          (ReplicateVisitor *this,
          vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
          *infoList,shared_ptr<OpenMD::AtomData> *data,Mat3x3d *box)

{
  element_type *peVar1;
  pointer psVar2;
  Vector<double,_3U> *v;
  shared_ptr<OpenMD::AtomInfo> newAtomInfo;
  __shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> local_88;
  ReplicateVisitor *local_70;
  shared_ptr<OpenMD::AtomData> *local_68;
  RectMatrix<double,_3U,_3U> *local_60;
  __shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  local_88._M_ptr = (AtomInfo *)0x0;
  local_88._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_70 = this;
  local_68 = data;
  local_60 = (RectMatrix<double,_3U,_3U> *)box;
  for (v = &((this->dir).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>;
      v != &((local_70->dir).
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->super_Vector<double,_3U>; v = v + 1) {
    for (psVar2 = (infoList->
                  super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        psVar2 != (infoList->
                  super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
      std::make_shared<OpenMD::AtomInfo>();
      std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&local_88,&local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      AtomInfo::operator=(local_88._M_ptr,
                          (psVar2->super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>)
                          ._M_ptr);
      operator*((Vector<double,_3U> *)&local_48,local_60,v);
      Vector<double,_3U>::add
                (&((local_88._M_ptr)->pos).super_Vector<double,_3U>,(Vector<double,_3U> *)&local_48)
      ;
      peVar1 = (local_68->super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_58,&local_88);
      std::
      vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
      ::push_back(&peVar1->data,(value_type *)&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  return;
}

Assistant:

void ReplicateVisitor::replicate(
      std::vector<std::shared_ptr<AtomInfo>>& infoList,
      std::shared_ptr<AtomData> data, const Mat3x3d& box) {
    std::shared_ptr<AtomInfo> newAtomInfo;
    std::vector<Vector3d>::iterator dirIter;
    std::vector<std::shared_ptr<AtomInfo>>::iterator i;

    for (dirIter = dir.begin(); dirIter != dir.end(); ++dirIter) {
      for (i = infoList.begin(); i != infoList.end(); ++i) {
        newAtomInfo  = std::make_shared<AtomInfo>();
        *newAtomInfo = *(*i);
        newAtomInfo->pos += box * (*dirIter);
        data->addAtomInfo(newAtomInfo);
      }
    }
  }